

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::LetDeclSymbol::LetDeclSymbol
          (LetDeclSymbol *this,Compilation *compilation,ExpressionSyntax *exprSyntax,
          string_view name,SourceLocation loc)

{
  (this->super_Symbol).kind = LetDecl;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  (this->ports)._M_ptr = (pointer)0x0;
  (this->ports)._M_extent._M_extent_value = 0;
  (this->exprSyntax).ptr = exprSyntax;
  return;
}

Assistant:

LetDeclSymbol::LetDeclSymbol(Compilation& compilation, const ExpressionSyntax& exprSyntax,
                             std::string_view name, SourceLocation loc) :
    Symbol(SymbolKind::LetDecl, name, loc), Scope(compilation, this), exprSyntax(&exprSyntax) {
}